

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::MovableMessageTest_MoveToArena_Test::
~MovableMessageTest_MoveToArena_Test(MovableMessageTest_MoveToArena_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MovableMessageTest, MoveToArena) {
  Arena arena;

  proto2_unittest::TestAllTypes message1;
  TestUtil::SetAllFields(&message1);
  const auto* nested = &message1.optional_nested_message();

  auto* message2_on_arena =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena);

  // Moving to a message on the arena should lead to a copy.
  *message2_on_arena = std::move(message1);
  EXPECT_NE(nested, &message2_on_arena->optional_nested_message());
  TestUtil::ExpectAllFieldsSet(message1);
  TestUtil::ExpectAllFieldsSet(*message2_on_arena);
}